

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O3

void __thiscall Refal2::CReceptacle::DigOutAll(CReceptacle *this,CUnitList *receptacle)

{
  CNodeType *pCVar1;
  
  if (this != (CReceptacle *)receptacle) {
    pCVar1 = (receptacle->super_CNodeList<Refal2::CUnit>).first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                (&receptacle->super_CNodeList<Refal2::CUnit>,pCVar1,
                 (receptacle->super_CNodeList<Refal2::CUnit>).last);
    }
    (receptacle->super_CNodeList<Refal2::CUnit>).first = (CNodeType *)0x0;
    (receptacle->super_CNodeList<Refal2::CUnit>).last = (CNodeType *)0x0;
    pCVar1 = (this->data).super_CNodeList<Refal2::CUnit>.first;
    (this->data).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (receptacle->super_CNodeList<Refal2::CUnit>).first = pCVar1;
    pCVar1 = (this->data).super_CNodeList<Refal2::CUnit>.last;
    (this->data).super_CNodeList<Refal2::CUnit>.last =
         (receptacle->super_CNodeList<Refal2::CUnit>).last;
    (receptacle->super_CNodeList<Refal2::CUnit>).last = pCVar1;
  }
  return;
}

Assistant:

inline void CNodeList<T>::Move( CNodeList& moveTo )
{
	if( this != &moveTo ) {
		moveTo.Empty();
		Swap( moveTo );
	}
}